

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall
Model::Model(Model *this,string *filename,bool diffuse_texture,bool normal_map,bool specular_texture
            )

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  double *pdVar4;
  istream *piVar5;
  vec<3UL,_double> *__x;
  long *plVar6;
  ostream *poVar7;
  size_t sVar8;
  size_type sVar9;
  allocator<char> local_541;
  string local_540;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  int local_470;
  int local_46c;
  int cnt;
  int n_1;
  int t;
  int f;
  size_t i_2;
  vec2f uv;
  size_t i_1;
  vec3f n;
  size_t i;
  vec3f v;
  string local_400 [6];
  char trash;
  istringstream local_3e0 [8];
  istringstream iss;
  string local_260 [8];
  string line;
  string local_238 [8];
  ifstream in;
  bool specular_texture_local;
  bool normal_map_local;
  bool diffuse_texture_local;
  string *filename_local;
  Model *this_local;
  
  std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::vector(&this->verts_);
  std::vector<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>::vector(&this->uv_);
  std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::vector(&this->norms_);
  std::vector<int,_std::allocator<int>_>::vector(&this->facet_vrt_);
  std::vector<int,_std::allocator<int>_>::vector(&this->facet_tex_);
  std::vector<int,_std::allocator<int>_>::vector(&this->facet_nrm_);
  TGAImage::TGAImage(&this->diffusemap_);
  TGAImage::TGAImage(&this->normalmap_);
  TGAImage::TGAImage(&this->specularmap_);
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,(_Ios_Openmode)filename);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(local_260);
    do {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        std::ifstream::close();
        poVar7 = std::operator<<((ostream *)&std::cerr,"# v# ");
        sVar8 = nverts(this);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
        poVar7 = std::operator<<(poVar7," f# ");
        sVar8 = nfaces(this);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar8);
        poVar7 = std::operator<<(poVar7," vt# ");
        sVar9 = std::vector<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>::size(&this->uv_);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar9);
        poVar7 = std::operator<<(poVar7," vn# ");
        sVar9 = std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::size
                          (&this->norms_);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,sVar9);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        if (diffuse_texture) {
          std::__cxx11::string::string((string *)&local_490,(string *)filename);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b0,"_diffuse.tga",&local_4b1);
          load_texture(this,&local_490,&local_4b0,&this->diffusemap_);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::allocator<char>::~allocator(&local_4b1);
          std::__cxx11::string::~string((string *)&local_490);
        }
        if (normal_map) {
          std::__cxx11::string::string((string *)&local_4d8,(string *)filename);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,"_nm_tangent.tga",&local_4f9);
          load_texture(this,&local_4d8,&local_4f8,&this->normalmap_);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator(&local_4f9);
          std::__cxx11::string::~string((string *)&local_4d8);
        }
        if (specular_texture) {
          std::__cxx11::string::string((string *)&local_520,(string *)filename);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_540,"_spec.tga",&local_541);
          load_texture(this,&local_520,&local_540,&this->specularmap_);
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator(&local_541);
          std::__cxx11::string::~string((string *)&local_520);
        }
        line.field_2._12_4_ = 0;
        break;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_238,local_260)
      ;
      __s = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_400,__s,(allocator<char> *)((long)&v.z + 7));
      std::__cxx11::istringstream::istringstream(local_3e0,local_400,_S_in);
      std::__cxx11::string::~string(local_400);
      std::allocator<char>::~allocator((allocator<char> *)((long)&v.z + 7));
      iVar3 = std::__cxx11::string::compare((ulong)local_260,0,(char *)0x2);
      if (iVar3 == 0) {
        std::operator>>((istream *)local_3e0,(char *)((long)&v.z + 6));
        vec<3UL,_double>::vec((vec<3UL,_double> *)&i);
        for (n.z = 0.0; (ulong)n.z < 3; n.z = (double)((long)n.z + 1)) {
          pdVar4 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)&i,(size_t)n.z);
          std::istream::operator>>((istream *)local_3e0,pdVar4);
        }
        std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::push_back
                  (&this->verts_,(value_type *)&i);
LAB_00108e4b:
        line.field_2._12_4_ = 0;
      }
      else {
        iVar3 = std::__cxx11::string::compare((ulong)local_260,0,(char *)0x3);
        if (iVar3 == 0) {
          piVar5 = std::operator>>((istream *)local_3e0,(char *)((long)&v.z + 6));
          std::operator>>(piVar5,(char *)((long)&v.z + 6));
          vec<3UL,_double>::vec((vec<3UL,_double> *)&i_1);
          for (uv.y = 0.0; (ulong)uv.y < 3; uv.y = (double)((long)uv.y + 1)) {
            pdVar4 = vec<3UL,_double>::operator[]((vec<3UL,_double> *)&i_1,(size_t)uv.y);
            std::istream::operator>>((istream *)local_3e0,pdVar4);
          }
          __x = vec<3UL,_double>::normalize((vec<3UL,_double> *)&i_1);
          std::vector<vec<3UL,_double>,_std::allocator<vec<3UL,_double>_>_>::push_back
                    (&this->norms_,__x);
          goto LAB_00108e4b;
        }
        iVar3 = std::__cxx11::string::compare((ulong)local_260,0,(char *)0x3);
        if (iVar3 == 0) {
          piVar5 = std::operator>>((istream *)local_3e0,(char *)((long)&v.z + 6));
          std::operator>>(piVar5,(char *)((long)&v.z + 6));
          vec<2UL,_double>::vec((vec<2UL,_double> *)&i_2);
          for (_t = 0; _t < 2; _t = _t + 1) {
            pdVar4 = vec<2UL,_double>::operator[]((vec<2UL,_double> *)&i_2,_t);
            std::istream::operator>>((istream *)local_3e0,pdVar4);
          }
          std::vector<vec<2UL,_double>,_std::allocator<vec<2UL,_double>_>_>::push_back
                    (&this->uv_,(value_type *)&i_2);
          goto LAB_00108e4b;
        }
        iVar3 = std::__cxx11::string::compare((ulong)local_260,0,(char *)0x2);
        if (iVar3 != 0) goto LAB_00108e4b;
        std::operator>>((istream *)local_3e0,(char *)((long)&v.z + 6));
        local_470 = 0;
        while( true ) {
          piVar5 = (istream *)std::istream::operator>>((istream *)local_3e0,&n_1);
          piVar5 = std::operator>>(piVar5,(char *)((long)&v.z + 6));
          piVar5 = (istream *)std::istream::operator>>(piVar5,&cnt);
          piVar5 = std::operator>>(piVar5,(char *)((long)&v.z + 6));
          plVar6 = (long *)std::istream::operator>>(piVar5,&local_46c);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
          if (!bVar2) break;
          n_1 = n_1 + -1;
          std::vector<int,_std::allocator<int>_>::push_back(&this->facet_vrt_,&n_1);
          cnt = cnt + -1;
          std::vector<int,_std::allocator<int>_>::push_back(&this->facet_tex_,&cnt);
          local_46c = local_46c + -1;
          std::vector<int,_std::allocator<int>_>::push_back(&this->facet_nrm_,&local_46c);
          local_470 = local_470 + 1;
        }
        if (local_470 == 3) goto LAB_00108e4b;
        poVar7 = std::operator<<((ostream *)&std::cerr,
                                 "Error: the obj file is supposed to be triangulated");
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::ifstream::close();
        line.field_2._12_4_ = 1;
      }
      std::__cxx11::istringstream::~istringstream(local_3e0);
    } while (line.field_2._12_4_ == 0);
    std::__cxx11::string::~string(local_260);
  }
  else {
    line.field_2._12_4_ = 1;
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

Model::Model(const std::string filename, bool diffuse_texture, bool normal_map,
             bool specular_texture)
{
    std::ifstream in;
    in.open(filename, std::ifstream::in);
    if (in.fail()) return;
    std::string line;
    while (!in.eof()) {
        std::getline(in, line);
        std::istringstream iss(line.c_str());
        char trash;
        if (!line.compare(0, 2, "v ")) {
            iss >> trash;
            vec3f v;
            for (size_t i = 0; i < 3; i++) iss >> v[i];
            verts_.push_back(v);
        } else if (!line.compare(0, 3, "vn ")) {
            iss >> trash >> trash;
            vec3f n;
            for (size_t i = 0; i < 3; i++) iss >> n[i];
            norms_.push_back(n.normalize());
        } else if (!line.compare(0, 3, "vt ")) {
            iss >> trash >> trash;
            vec2f uv;
            for (size_t i = 0; i < 2; i++) iss >> uv[i];
            uv_.push_back(uv);
        } else if (!line.compare(0, 2, "f ")) {
            int f, t, n;
            iss >> trash;
            int cnt = 0;
            while (iss >> f >> trash >> t >> trash >> n) {
                facet_vrt_.push_back(--f);
                facet_tex_.push_back(--t);
                facet_nrm_.push_back(--n);
                cnt++;
            }
            if (3 != cnt) {
                std::cerr << "Error: the obj file is supposed to be triangulated" << std::endl;
                in.close();
                return;
            }
        }
    }
    in.close();
    std::cerr << "# v# " << nverts() << " f# " << nfaces() << " vt# " << uv_.size() << " vn# "
              << norms_.size() << std::endl;
    if (diffuse_texture) load_texture(filename, "_diffuse.tga", diffusemap_);
    if (normal_map) load_texture(filename, "_nm_tangent.tga", normalmap_);
    if (specular_texture) load_texture(filename, "_spec.tga", specularmap_);
}